

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_get_rows(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (((((a->ne[2] == 1) && (a->ne[3] == 1)) && (b->ne[1] == 1)) &&
      ((b->ne[2] == 1 && (b->ne[3] == 1)))) && (b->type == GGML_TYPE_I32)) {
    if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
      pgVar1 = ggml_new_tensor_2d(ctx,GGML_TYPE_F32,a->ne[0],b->ne[0]);
      pgVar1->op = GGML_OP_GET_ROWS;
      pgVar1->grad = (ggml_tensor *)0x0;
      pgVar1->src0 = a;
      pgVar1->src1 = b;
      return pgVar1;
    }
    pcVar3 = "false";
    uVar2 = 0xf9b;
  }
  else {
    pcVar3 = "ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32";
    uVar2 = 0xf96;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar2,
          pcVar3);
  abort();
}

Assistant:

struct ggml_tensor * ggml_get_rows(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32);

    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: implement non F32 return
    //struct ggml_tensor * result = ggml_new_tensor_2d(ctx, a->type, a->ne[0], b->ne[0]);
    struct ggml_tensor * result = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, a->ne[0], b->ne[0]);

    result->op   = GGML_OP_GET_ROWS;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}